

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep.c
# Opt level: O0

void * lsrkStep_Create_Commons(ARKRhsFn rhs,sunrealtype t0,N_Vector y0,SUNContext_conflict sunctx)

{
  uint uVar1;
  ARKodeMem ark_mem_00;
  N_Vector in_RDX;
  sunrealtype in_RSI;
  SUNContext_conflict in_RDI;
  ARKodeMem in_XMM0_Qa;
  int retval;
  ARKodeLSRKStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  SUNContext_conflict in_stack_ffffffffffffffc8;
  ARKodeMem local_8;
  
  if (in_RDI == (SUNContext_conflict)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x16,0x81,"lsrkStep_Create_Commons",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                    ,"Must specify at least one of fe, fi (both NULL).");
    local_8 = (ARKodeMem)0x0;
  }
  else if (in_RSI == 0.0) {
    arkProcessError((ARKodeMem)0x0,-0x16,0x89,"lsrkStep_Create_Commons",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                    ,"y0 = NULL illegal.");
    local_8 = (ARKodeMem)0x0;
  }
  else if (in_RDX == (N_Vector)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x16,0x90,"lsrkStep_Create_Commons",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                    ,"sunctx = NULL illegal.");
    local_8 = (ARKodeMem)0x0;
  }
  else {
    local_8 = arkCreate(in_stack_ffffffffffffffc8);
    if (local_8 == (ARKodeMem)0x0) {
      arkProcessError((ARKodeMem)0x0,-0x15,0x99,"lsrkStep_Create_Commons",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                      ,"arkode_mem = NULL illegal.");
      local_8 = (ARKodeMem)0x0;
    }
    else {
      ark_mem_00 = (ARKodeMem)calloc(1,0xa8);
      if (ark_mem_00 == (ARKodeMem)0x0) {
        arkProcessError(local_8,-0x14,0xa2,"lsrkStep_Create_Commons",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                        ,"Allocation of arkode_mem failed.");
        ARKodeFree((void **)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        local_8 = (ARKodeMem)0x0;
      }
      else {
        local_8->step_init = lsrkStep_Init;
        local_8->step_fullrhs = lsrkStep_FullRHS;
        local_8->step = lsrkStep_TakeStepRKC;
        local_8->step_printallstats = lsrkStep_PrintAllStats;
        local_8->step_writeparameters = lsrkStep_WriteParameters;
        local_8->step_free = lsrkStep_Free;
        local_8->step_printmem = lsrkStep_PrintMem;
        local_8->step_setdefaults = lsrkStep_SetDefaults;
        local_8->step_getnumrhsevals = lsrkStep_GetNumRhsEvals;
        local_8->step_getestlocalerrors = lsrkStep_GetEstLocalErrors;
        local_8->step_mem = ark_mem_00;
        local_8->step_supports_adaptive = 1;
        uVar1 = lsrkStep_SetDefaults(ark_mem_00);
        if (uVar1 == 0) {
          ark_mem_00->sunctx = in_RDI;
          ark_mem_00->uround = 0.0;
          ark_mem_00->reltol = 0.0;
          *(undefined4 *)&ark_mem_00->Vabstol = 0;
          ark_mem_00->Sabstol = 0.0;
          *(undefined4 *)((long)&ark_mem_00->Vabstol + 4) = 200;
          *(undefined8 *)&ark_mem_00->atolmin0 = 0;
          uVar1 = arkInit(in_XMM0_Qa,in_RSI,in_RDX,(int)((ulong)local_8 >> 0x20));
          if (uVar1 == 0) {
            ARKodeSetInterpolantType(ark_mem_00,0);
          }
          else {
            arkProcessError(local_8,(int)(ulong)uVar1,0xd1,"lsrkStep_Create_Commons",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                            ,"Unable to initialize main ARKODE infrastructure");
            ARKodeFree((void **)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
            local_8 = (ARKodeMem)0x0;
          }
        }
        else {
          arkProcessError(local_8,(int)(ulong)uVar1,0xba,"lsrkStep_Create_Commons",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                          ,"Error setting default solver options");
          ARKodeFree((void **)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
          local_8 = (ARKodeMem)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

void* lsrkStep_Create_Commons(ARKRhsFn rhs, sunrealtype t0, N_Vector y0,
                              SUNContext sunctx)
{
  ARKodeMem ark_mem;
  ARKodeLSRKStepMem step_mem;
  int retval;

  /* Check that rhs is supplied */
  if (rhs == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_F);
    return NULL;
  }

  /* Check for legal input parameters */
  if (y0 == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return NULL;
  }

  if (sunctx == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_SUNCTX);
    return NULL;
  }

  /* Create ark_mem structure and set default values */
  ark_mem = arkCreate(sunctx);
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return NULL;
  }

  /* Allocate ARKodeLSRKStepMem structure, and initialize to zero */
  step_mem = (ARKodeLSRKStepMem)calloc(1, sizeof(*step_mem));
  if (step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_ARKMEM_FAIL);
    ARKodeFree((void**)&ark_mem);
    return NULL;
  }

  /* Attach step_mem structure and function pointers to ark_mem */
  ark_mem->step_init              = lsrkStep_Init;
  ark_mem->step_fullrhs           = lsrkStep_FullRHS;
  ark_mem->step                   = lsrkStep_TakeStepRKC;
  ark_mem->step_printallstats     = lsrkStep_PrintAllStats;
  ark_mem->step_writeparameters   = lsrkStep_WriteParameters;
  ark_mem->step_free              = lsrkStep_Free;
  ark_mem->step_printmem          = lsrkStep_PrintMem;
  ark_mem->step_setdefaults       = lsrkStep_SetDefaults;
  ark_mem->step_getnumrhsevals    = lsrkStep_GetNumRhsEvals;
  ark_mem->step_getestlocalerrors = lsrkStep_GetEstLocalErrors;
  ark_mem->step_mem               = (void*)step_mem;
  ark_mem->step_supports_adaptive = SUNTRUE;

  /* Set default values for optional inputs */
  retval = lsrkStep_SetDefaults((void*)ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Error setting default solver options");
    ARKodeFree((void**)&ark_mem);
    return NULL;
  }

  /* Copy the input parameters into ARKODE state */
  step_mem->fe = rhs;

  /* Set NULL for dom_eig_fn */
  step_mem->dom_eig_fn = NULL;

  /* Initialize all the counters */
  step_mem->nfe               = 0;
  step_mem->stage_max         = 0;
  step_mem->dom_eig_num_evals = 0;
  step_mem->stage_max_limit   = STAGE_MAX_LIMIT_DEFAULT;
  step_mem->dom_eig_nst       = 0;

  /* Initialize main ARKODE infrastructure */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to initialize main ARKODE infrastructure");
    ARKodeFree((void**)&ark_mem);
    return NULL;
  }

  /* Specify preferred interpolation type */
  ARKodeSetInterpolantType(ark_mem, ARK_INTERP_LAGRANGE);

  return (void*)ark_mem;
}